

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

TPZCompMesh * __thiscall TPZMHMeshControl::CriaMalhaTemporaria(TPZMHMeshControl *this)

{
  int dim;
  TPZReference *pTVar1;
  TPZGeoEl *pTVar2;
  TPZAdmChunkVector<TPZGeoEl_*,_10> *this_00;
  int iVar3;
  int iVar4;
  TPZGeoEl **ppTVar5;
  _Base_ptr p_Var6;
  TPZCompMesh *this_01;
  TPZL2Projection<double> *this_02;
  _Base_ptr p_Var7;
  TPZBndCond *mat;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_header *p_Var9;
  _Rb_tree_header *p_Var10;
  int iVar11;
  TPZL2Projection<double> *pTVar12;
  int64_t iVar13;
  TPZCreateApproximationSpace *this_03;
  _Self __tmp;
  TPZManVector<double,_1> sol;
  int materialid;
  TPZGeoElSide neighbour;
  set<int,_std::less<int>,_std::allocator<int>_> bcids;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZVec<double> local_190;
  double dStack_170;
  TPZGeoMesh *local_168;
  long local_160;
  undefined **local_158;
  TPZVec<double> local_150;
  TPZFMatrix<double> local_130;
  _Rb_tree_header *local_a0;
  double local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  TPZGeoMesh::ResetReference(((this->fGMesh).fRef)->fPointer);
  pTVar1 = (this->fGMesh).fRef;
  dim = pTVar1->fPointer->fDim;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168 = pTVar1->fPointer;
  local_160 = (local_168->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < local_160) {
    this_00 = &local_168->fElementVec;
    p_Var9 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
    iVar13 = 0;
    do {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&this_00->super_TPZChunkVector<TPZGeoEl_*,_10>,iVar13);
      pTVar2 = *ppTVar5;
      if ((pTVar2 != (TPZGeoEl *)0x0) &&
         (iVar3 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2), iVar3 == dim)) {
        p_Var7 = (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var9->_M_header;
        for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
            p_Var7 = (&p_Var7->_M_left)[(long)*(size_t *)(p_Var7 + 1) < iVar13]) {
          if (iVar13 <= (long)*(size_t *)(p_Var7 + 1)) {
            p_Var6 = p_Var7;
          }
        }
        p_Var10 = p_Var9;
        if (((_Rb_tree_header *)p_Var6 != p_Var9) &&
           (p_Var10 = (_Rb_tree_header *)p_Var6,
           iVar13 < (long)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
          p_Var10 = p_Var9;
        }
        if (p_Var10 != p_Var9) {
          local_150._vptr_TPZVec =
               (_func_int **)CONCAT44(local_150._vptr_TPZVec._4_4_,pTVar2->fMatId);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,(int *)&local_150);
          iVar3 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
          if (0 < iVar3) {
            iVar11 = 0;
            do {
              iVar4 = (**(code **)(*(long *)pTVar2 + 0x208))(pTVar2,iVar11);
              if (iVar4 == dim + -1) {
                (**(code **)(*(long *)pTVar2 + 0x188))(&local_130,pTVar2,iVar11);
                while (((TPZGeoEl *)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
                        pTVar2 ||
                       ((int)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol != iVar11)))
                {
                  iVar4 = (**(code **)(*(long *)local_130.super_TPZMatrix<double>.
                                                super_TPZBaseMatrix.fRow + 0x210))();
                  if (iVar4 == dim + -1) {
                    local_190._vptr_TPZVec =
                         (_func_int **)
                         CONCAT44(local_190._vptr_TPZVec._4_4_,
                                  *(int *)(local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.
                                           fRow + 0x18));
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    _M_insert_unique<int>(&local_90,(int *)&local_190);
                  }
                  if ((TPZGeoEl *)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
                      (TPZGeoEl *)0x0) {
                    local_190._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_01920090;
                    local_190.fStore = (double *)0x0;
                    local_190.fNElements = CONCAT44(local_190.fNElements._4_4_,0xffffffff);
                  }
                  else {
                    (**(code **)(*(long *)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
                                + 0x188))
                              (&local_190,local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
                               ,local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol &
                                0xffffffff);
                  }
                  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                       (int64_t)local_190.fStore;
                  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
                       CONCAT44(local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                                (undefined4)local_190.fNElements);
                }
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 != iVar3);
          }
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != local_160);
  }
  this_01 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(this_01,&this->fGMesh,false);
  p_Var9 = &local_60._M_impl.super__Rb_tree_header;
  this_01->fDimModel = dim;
  TPZVec<double>::TPZVec(&local_190,0);
  local_190.fStore = &dStack_170;
  local_158 = &PTR__TPZManVector_018df490;
  local_190._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018df490;
  local_190.fNElements = 1;
  local_190.fNAlloc = 0;
  dStack_170 = 0.0;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var9) {
    pTVar12 = (TPZL2Projection<double> *)0x0;
  }
  else {
    pTVar12 = (TPZL2Projection<double> *)0x0;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this_02 = (TPZL2Projection<double> *)operator_new(0xb0);
      TPZL2Projection<double>::TPZL2Projection(this_02,p_Var7[1]._M_color,dim,1,&local_190);
      TPZCompMesh::InsertMaterialObject(this_01,(TPZMaterial *)this_02);
      if (pTVar12 == (TPZL2Projection<double> *)0x0) {
        pTVar12 = this_02;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  if (pTVar12 == (TPZL2Projection<double> *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x211);
  }
  p_Var8 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    do {
      local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
      local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
      local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      local_130.fElem = (double *)0x0;
      local_130.fGiven = (double *)0x0;
      local_130.fSize = 0;
      TPZVec<int>::TPZVec(&local_130.fPivot.super_TPZVec<int>,0);
      local_130.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_130.fPivot.super_TPZVec<int>.fStore = local_130.fPivot.fExtAlloc;
      local_130.fPivot.super_TPZVec<int>.fNElements = 0;
      local_130.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_130.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_130.fWork.fStore = (double *)0x0;
      local_130.fWork.fNElements = 0;
      local_130.fWork.fNAlloc = 0;
      local_130.fElem = (double *)operator_new__(0x20);
      local_130.fElem[2] = 0.0;
      local_130.fElem[3] = 0.0;
      *local_130.fElem = 0.0;
      local_130.fElem[1] = 0.0;
      local_98 = 0.0;
      TPZVec<double>::TPZVec(&local_150,2,&local_98);
      mat = (TPZBndCond *)
            (**(code **)(*(long *)pTVar12 + 0xb8))
                      (pTVar12,pTVar12,p_Var8[1]._M_color,0,&local_130,&local_150);
      TPZCompMesh::InsertMaterialObject(this_01,mat);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      local_150._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      if ((TPZGeoEl *)local_150.fStore != (TPZGeoEl *)0x0) {
        operator_delete__(local_150.fStore);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_130);
    } while ((_Rb_tree_header *)p_Var8 != &local_90._M_impl.super__Rb_tree_header);
  }
  this_03 = &this_01->fCreate;
  TPZCreateApproximationSpace::SetAllCreateFunctionsDiscontinuous(this_03);
  if (0 < local_160) {
    local_168 = (TPZGeoMesh *)&local_168->fElementVec;
    local_a0 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
    iVar13 = 0;
    do {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZGeoEl_*,_10> *)local_168,iVar13);
      pTVar2 = *ppTVar5;
      if ((pTVar2 != (TPZGeoEl *)0x0) &&
         (iVar3 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2), iVar3 == dim)) {
        p_Var9 = local_a0;
        for (p_Var7 = (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
            p_Var7 = (&p_Var7->_M_left)[(long)*(size_t *)(p_Var7 + 1) < iVar13]) {
          if (iVar13 <= (long)*(size_t *)(p_Var7 + 1)) {
            p_Var9 = (_Rb_tree_header *)p_Var7;
          }
        }
        p_Var10 = local_a0;
        if ((p_Var9 != local_a0) && (p_Var10 = p_Var9, iVar13 < (long)p_Var9->_M_node_count)) {
          p_Var10 = local_a0;
        }
        if (p_Var10 != local_a0) {
          TPZCreateApproximationSpace::CreateCompEl(this_03,pTVar2,this_01);
          iVar3 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
          if (0 < iVar3) {
            iVar11 = 0;
            do {
              iVar4 = (**(code **)(*(long *)pTVar2 + 0x208))(pTVar2,iVar11);
              if (iVar4 == dim + -1) {
                (**(code **)(*(long *)pTVar2 + 0x188))(&local_130,pTVar2,iVar11);
                while (((TPZGeoEl *)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
                        pTVar2 ||
                       ((int)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol != iVar11)))
                {
                  iVar4 = (**(code **)(*(long *)local_130.super_TPZMatrix<double>.
                                                super_TPZBaseMatrix.fRow + 0x210))();
                  if (iVar4 == dim + -1) {
                    iVar4 = *(int *)(local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
                                    0x18);
                    p_Var7 = &local_90._M_impl.super__Rb_tree_header._M_header;
                    for (p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
                        (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                        p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar4]) {
                      if (iVar4 <= (int)*(size_t *)(p_Var6 + 1)) {
                        p_Var7 = p_Var6;
                      }
                    }
                    p_Var9 = &local_90._M_impl.super__Rb_tree_header;
                    p_Var10 = p_Var9;
                    if (((_Rb_tree_header *)p_Var7 != p_Var9) &&
                       (p_Var10 = (_Rb_tree_header *)p_Var7,
                       iVar4 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
                      p_Var10 = p_Var9;
                    }
                    if (p_Var10 != p_Var9) {
                      TPZCreateApproximationSpace::CreateCompEl
                                (this_03,(TPZGeoEl *)
                                         local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
                                 this_01);
                    }
                  }
                  if ((TPZGeoEl *)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
                      (TPZGeoEl *)0x0) {
                    local_150._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_01920090;
                    local_150.fStore = (double *)0x0;
                    local_150.fNElements._0_4_ = 0xffffffff;
                  }
                  else {
                    (**(code **)(*(long *)local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
                                + 0x188))
                              (&local_150,local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
                               ,local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol &
                                0xffffffff);
                  }
                  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                       (int64_t)local_150.fStore;
                  local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
                       CONCAT44(local_130.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                                (undefined4)local_150.fNElements);
                }
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 != iVar3);
          }
        }
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != local_160);
  }
  TPZCreateApproximationSpace::CreateInterfaces(this_01);
  (**(code **)(*(long *)this_01 + 0x60))(this_01);
  if (local_190.fStore == &dStack_170) {
    local_190.fStore = (double *)0x0;
  }
  local_190.fNAlloc = 0;
  local_190._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_190.fStore != (double *)0x0) {
    operator_delete__(local_190.fStore);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return this_01;
}

Assistant:

TPZCompMesh* TPZMHMeshControl::CriaMalhaTemporaria()
{
    fGMesh->ResetReference();
	/// criar materiais
	int dim = fGMesh->Dimension();
    std::set<int> matids, bcids;
    TPZGeoMesh &gmesh = fGMesh;
    int64_t nel = gmesh.NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        int materialid = gel->MaterialId();
        matids.insert(materialid);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    bcids.insert(neighbour.Element()->MaterialId());
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCompMesh *cmesh = new TPZCompMesh(fGMesh);
	cmesh->SetDimModel(dim);
    TPZManVector<STATE,1> sol(1,0.);
    int nstate = 1;
    std::set<int>::iterator it = matids.begin();
    TPZMaterialT<STATE> *meshmat = nullptr;
    while (it != matids.end()) {
        TPZL2Projection<STATE> *material = new TPZL2Projection(*it,dim,nstate,sol);
        cmesh->InsertMaterialObject(material);
        if (!meshmat) {
            meshmat = material;
        }
        it++;

    }

    if (!meshmat) {
        DebugStop();
    }

	it = bcids.begin();
    while (it != bcids.end()) {
        ///Inserir condicao de contorno
        TPZFMatrix<STATE> val1(2,2,0.);
        TPZVec<STATE> val2(2,0.);

        TPZBndCond * BCondD1 = meshmat->CreateBC(meshmat, *it,0, val1, val2);
        cmesh->InsertMaterialObject(BCondD1);

        it++;
    }

    cmesh->SetAllCreateFunctionsDiscontinuous();
    TPZCreateApproximationSpace &create = cmesh->ApproxSpace();

    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        create.CreateCompEl(gel, *cmesh);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    int matid = neighbour.Element()->MaterialId();
                    if (bcids.find(matid) != bcids.end()) {
                        create.CreateCompEl(neighbour.Element(), *cmesh);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCreateApproximationSpace::CreateInterfaces(*cmesh);
    cmesh->ExpandSolution();
    return cmesh;
}